

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O2

int32_t FastPForLib::Simple8b_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint64_t *output,
                  int32_t outOffset)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint32_t remainingCount;
  uint count;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar7 = inCount + inOffset;
  uVar12 = outOffset;
  do {
    count = uVar7 - inOffset;
    if (uVar7 < (uint)inOffset || count == 0) {
      return uVar12 - outOffset;
    }
    uVar4 = tryRunLength(input,inOffset,count);
    if (uVar4 == 0) {
      lVar3 = 1;
      do {
        lVar8 = lVar3;
        if (lVar8 == 0xf) goto LAB_001283d9;
        uVar2 = *(uint *)(Simple8b_Codec_bitLength + (uint)((0xf - (int)lVar8) * 4));
        if (count <= *(uint *)(Simple8b_Codec_bitLength + (uint)((0xf - (int)lVar8) * 4))) {
          uVar2 = count;
        }
        uVar6 = lVar8 << 0x3c;
        uVar9 = 0;
        uVar5 = (ulong)uVar2;
        uVar10 = inOffset;
        while( true ) {
          uVar11 = (ulong)uVar10;
          if (uVar5 == 0) goto LAB_001283cd;
          if (input[uVar11] >> ((ulong)*(uint *)(Simple8b_Codec_bitLength + lVar8 * 4) & 0x3f) != 0)
          break;
          uVar1 = uVar9 & 0x3f;
          uVar9 = (ulong)((int)uVar9 + *(uint *)(Simple8b_Codec_bitLength + lVar8 * 4));
          uVar10 = uVar10 + 1;
          uVar6 = uVar6 | (ulong)input[uVar11] << uVar1;
          uVar5 = uVar5 - 1;
        }
        lVar3 = lVar8 + 1;
      } while ((int)uVar5 != 0);
LAB_001283cd:
      inOffset = uVar2 + inOffset;
      if (lVar8 == 0xf) {
LAB_001283d9:
        uVar5 = (ulong)(uint)inOffset;
        inOffset = inOffset + 1;
        uVar6 = (ulong)input[uVar5] | 0xf000000000000000;
      }
    }
    else {
      if (0xffffffe < uVar4) {
        uVar4 = 0xfffffff;
      }
      uVar5 = (ulong)(uint)inOffset;
      inOffset = uVar4 + inOffset;
      uVar6 = CONCAT44(uVar4,input[uVar5]) | 0xf000000000000000;
    }
    uVar5 = (ulong)uVar12;
    uVar12 = uVar12 + 1;
    output[uVar5] = uVar6;
  } while( true );
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint64_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint64_t outVal = 0;

#if defined(_SIMPLE8B_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint64_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (static_cast<uint64_t>(SIMPLE8B_MAXCODE) << SIMPLE8B_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += static_cast<uint32_t>(repeatCount);
      } else
#endif
      {
        // otherwise try all the bit packing possibilities
        uint32_t code = SIMPLE8B_MINCODE;
        for (; code < SIMPLE8B_MAXCODE; code++) {
          uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
          uint32_t bitLen = Simple8b_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint64_t maxVal = (1ULL << bitLen) - 1;
          uint64_t val = static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint64_t inputVal = static_cast<uint64_t>(input[inPos + j]);
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value
        if (code == SIMPLE8B_MAXCODE) {
          outVal = (static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE) |
                   input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }